

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O2

bool __thiscall QSqlQuery::seek(QSqlQuery *this,int index,bool relative)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  _func_int **pp_Var4;
  QSqlResult *pQVar5;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isSelect(this);
  if ((bVar1) && (bVar1 = isActive(this), bVar1)) {
    if (relative) {
      iVar3 = at(this);
      if (iVar3 == -2) {
        if (-1 < index) goto LAB_00122c5c;
        (*this->d->sqlResult->_vptr_QSqlResult[0x15])();
        iVar3 = at(this);
        index = index + iVar3 + 1;
      }
      else if (iVar3 == -1) {
        if (index < 1) goto LAB_00122c5c;
        index = index - 1;
      }
      else {
        iVar3 = at(this);
        if (iVar3 + index < 0) goto LAB_00122c2e;
        iVar3 = at(this);
        index = iVar3 + index;
      }
LAB_00122b78:
      bVar1 = isForwardOnly(this);
      if ((bVar1) && (iVar3 = at(this), index < iVar3)) {
        lcSqlQuery();
        if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
           ) {
          local_40[0] = '\x02';
          local_40[1] = '\0';
          local_40[2] = '\0';
          local_40[3] = '\0';
          local_40[4] = '\0';
          local_40[5] = '\0';
          local_40[6] = '\0';
          local_40[7] = '\0';
          local_40[8] = '\0';
          local_40[9] = '\0';
          local_40[10] = '\0';
          local_40[0xb] = '\0';
          local_40[0xc] = '\0';
          local_40[0xd] = '\0';
          local_40[0xe] = '\0';
          local_40[0xf] = '\0';
          local_40[0x10] = '\0';
          local_40[0x11] = '\0';
          local_40[0x12] = '\0';
          local_40[0x13] = '\0';
          local_40[0x14] = '\0';
          local_40[0x15] = '\0';
          local_40[0x16] = '\0';
          local_40[0x17] = '\0';
          local_28 = lcSqlQuery::category.name;
          bVar1 = false;
          QMessageLogger::warning
                    (local_40,"QSqlQuery::seek: cannot seek backwards in a forward only query");
          goto LAB_00122c5e;
        }
        goto LAB_00122c5c;
      }
      iVar3 = at(this);
      if ((index == iVar3 + 1U) && (iVar3 = at(this), iVar3 != -1)) {
        iVar3 = (*this->d->sqlResult->_vptr_QSqlResult[0x12])();
        cVar2 = (char)iVar3;
      }
      else {
        iVar3 = at(this);
        pQVar5 = this->d->sqlResult;
        pp_Var4 = pQVar5->_vptr_QSqlResult;
        if (index == iVar3 - 1U) {
          iVar3 = (*pp_Var4[0x13])();
          bVar1 = true;
          if ((char)iVar3 != '\0') goto LAB_00122c5e;
          goto LAB_00122c2e;
        }
        iVar3 = (*pp_Var4[0x11])(pQVar5,(ulong)(uint)index);
        cVar2 = (char)iVar3;
      }
      bVar1 = true;
      if (cVar2 != '\0') goto LAB_00122c5e;
      pQVar5 = this->d->sqlResult;
      pp_Var4 = pQVar5->_vptr_QSqlResult;
      uStack_50 = 0xfffffffffffffffe;
    }
    else {
      if (-1 < index) goto LAB_00122b78;
LAB_00122c2e:
      pQVar5 = this->d->sqlResult;
      pp_Var4 = pQVar5->_vptr_QSqlResult;
      uStack_50 = 0xffffffffffffffff;
    }
    (*pp_Var4[3])(pQVar5,uStack_50);
  }
LAB_00122c5c:
  bVar1 = false;
LAB_00122c5e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QSqlQuery::seek(int index, bool relative)
{
    if (!isSelect() || !isActive())
        return false;
    int actualIdx;
    if (!relative) { // arbitrary seek
        if (index < 0) {
            d->sqlResult->setAt(QSql::BeforeFirstRow);
            return false;
        }
        actualIdx = index;
    } else {
        switch (at()) { // relative seek
        case QSql::BeforeFirstRow:
            if (index > 0)
                actualIdx = index - 1;
            else {
                return false;
            }
            break;
        case QSql::AfterLastRow:
            if (index < 0) {
                d->sqlResult->fetchLast();
                actualIdx = at() + index + 1;
            } else {
                return false;
            }
            break;
        default:
            if ((at() + index) < 0) {
                d->sqlResult->setAt(QSql::BeforeFirstRow);
                return false;
            }
            actualIdx = at() + index;
            break;
        }
    }
    // let drivers optimize
    if (isForwardOnly() && actualIdx < at()) {
        qCWarning(lcSqlQuery, "QSqlQuery::seek: cannot seek backwards in a forward only query");
        return false;
    }
    if (actualIdx == (at() + 1) && at() != QSql::BeforeFirstRow) {
        if (!d->sqlResult->fetchNext()) {
            d->sqlResult->setAt(QSql::AfterLastRow);
            return false;
        }
        return true;
    }
    if (actualIdx == (at() - 1)) {
        if (!d->sqlResult->fetchPrevious()) {
            d->sqlResult->setAt(QSql::BeforeFirstRow);
            return false;
        }
        return true;
    }
    if (!d->sqlResult->fetch(actualIdx)) {
        d->sqlResult->setAt(QSql::AfterLastRow);
        return false;
    }
    return true;
}